

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad-helpers.c
# Opt level: O0

u_int get_figure_of_merit(pcap_if_t *dev)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  uint local_1c;
  char *pcStack_18;
  u_int n;
  char *cp;
  pcap_if_t *dev_local;
  
  iVar3 = strcmp(dev->name,"any");
  if (iVar3 == 0) {
    local_1c = 0x1fffffff;
  }
  else {
    pcVar1 = dev->name;
    sVar4 = strlen(dev->name);
    pcVar1 = pcVar1 + sVar4;
    do {
      pcStack_18 = pcVar1 + -1;
      bVar2 = false;
      if ((dev->name <= pcVar1 + -2) && (bVar2 = false, '/' < pcVar1[-2])) {
        bVar2 = pcVar1[-2] < ':';
      }
      pcVar1 = pcStack_18;
    } while (bVar2);
    if ((*pcStack_18 < '0') || ('9' < *pcStack_18)) {
      local_1c = 0;
    }
    else {
      local_1c = atoi(pcStack_18);
    }
  }
  if ((dev->flags & 4) == 0) {
    local_1c = local_1c | 0x80000000;
  }
  if ((dev->flags & 2) == 0) {
    local_1c = local_1c | 0x40000000;
  }
  if ((dev->flags & 1) != 0) {
    local_1c = local_1c | 0x20000000;
  }
  return local_1c;
}

Assistant:

static u_int
get_figure_of_merit(pcap_if_t *dev)
{
	const char *cp;
	u_int n;

	if (strcmp(dev->name, "any") == 0) {
		/*
		 * Give the "any" device an artificially high instance
		 * number, so it shows up after all other non-loopback
		 * interfaces.
		 */
		n = 0x1FFFFFFF;	/* 29 all-1 bits */
	} else {
		/*
		 * A number at the end of the device name string is
		 * assumed to be a unit number.
		 */
		cp = dev->name + strlen(dev->name) - 1;
		while (cp-1 >= dev->name && *(cp-1) >= '0' && *(cp-1) <= '9')
			cp--;
		if (*cp >= '0' && *cp <= '9')
			n = atoi(cp);
		else
			n = 0;
	}
	if (!(dev->flags & PCAP_IF_RUNNING))
		n |= 0x80000000;
	if (!(dev->flags & PCAP_IF_UP))
		n |= 0x40000000;
	if (dev->flags & PCAP_IF_LOOPBACK)
		n |= 0x20000000;
	return (n);
}